

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
          (InternalMetadata *this,string *other)

{
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  InternalMetadata *in_RDI;
  InternalMetadata *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  if (((uint)in_RDI->ptr_ & 1) == 1) {
    pCVar1 = PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                       (in_RDI);
    local_18 = &pCVar1->unknown_fields;
  }
  else {
    local_18 = mutable_unknown_fields_slow<std::__cxx11::string>(unaff_retaddr);
  }
  std::__cxx11::string::swap((string *)local_18);
  return;
}

Assistant:

inline void InternalMetadata::DoSwap<std::string>(std::string* other) {
  mutable_unknown_fields<std::string>()->swap(*other);
}